

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_1::parseAttributeValues
               (EGLint *attribList,EGLint *majorVersion,EGLint *minorVersion,EGLint *robustAccessExt
               )

{
  int iVar1;
  
  do {
    iVar1 = *attribList;
    do {
      if (iVar1 == 0x3038) {
        return;
      }
      if (iVar1 == 0x3098) {
        *majorVersion = attribList[1];
        goto LAB_0022563d;
      }
      if (iVar1 == 0x3138) goto LAB_0022563d;
      if (iVar1 == 0x30fb) {
        *minorVersion = attribList[1];
        goto LAB_0022563d;
      }
    } while (iVar1 != 0x30bf);
    *robustAccessExt = attribList[1];
LAB_0022563d:
    attribList = attribList + 2;
  } while( true );
}

Assistant:

void parseAttributeValues (const EGLint* attribList, EGLint& majorVersion, EGLint& minorVersion, EGLint& robustAccessExt)
{
	const EGLint* iter = attribList;

	while ((*iter) != EGL_NONE)
	{
		switch (*iter)
		{
			case EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT:
				iter++;
				robustAccessExt = *iter;
				iter++;
				break;

			case EGL_CONTEXT_MAJOR_VERSION_KHR:
				iter++;
				majorVersion = (*iter);
				iter++;
				break;

			case EGL_CONTEXT_MINOR_VERSION_KHR:
				iter++;
				minorVersion = (*iter);
				iter++;
				break;

			case EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT:
				iter++;
				iter++;
				break;

			default:
				DE_FATAL("Unsupported EGL attribute");
		}
	}
}